

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

int ftpfilemethod(OperationConfig *config,char *str)

{
  int iVar1;
  char *str_local;
  OperationConfig *config_local;
  
  iVar1 = curl_strequal("singlecwd",str);
  if (iVar1 == 0) {
    iVar1 = curl_strequal("nocwd",str);
    if (iVar1 == 0) {
      iVar1 = curl_strequal("multicwd",str);
      if (iVar1 == 0) {
        warnf(config->global,"unrecognized ftp file method \'%s\', using default\n",str);
        config_local._4_4_ = 1;
      }
      else {
        config_local._4_4_ = 1;
      }
    }
    else {
      config_local._4_4_ = 2;
    }
  }
  else {
    config_local._4_4_ = 3;
  }
  return config_local._4_4_;
}

Assistant:

int ftpfilemethod(struct OperationConfig *config, const char *str)
{
  if(curl_strequal("singlecwd", str))
    return CURLFTPMETHOD_SINGLECWD;
  if(curl_strequal("nocwd", str))
    return CURLFTPMETHOD_NOCWD;
  if(curl_strequal("multicwd", str))
    return CURLFTPMETHOD_MULTICWD;

  warnf(config->global, "unrecognized ftp file method '%s', using default\n",
        str);

  return CURLFTPMETHOD_MULTICWD;
}